

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseData.cpp
# Opt level: O3

void __thiscall SGParser::Generator::StdGrammarStackElement::Cleanup(StdGrammarStackElement *this)

{
  StdGrammarStackElement *pSVar1;
  ulong uVar2;
  StdGrammarStackElement *this_00;
  vector<SGParser::Generator::StdGrammarStackElement,_std::allocator<SGParser::Generator::StdGrammarStackElement>_>
  *__range3;
  StdGrammarStackElement *se;
  StdGrammarStackElement *this_01;
  
  this_00 = (StdGrammarStackElement *)(this->field_1).pStringVec;
  if (this_00 == (StdGrammarStackElement *)0x0) {
    return;
  }
  switch(this->Type + 0xf0000000 >> 0x1c) {
  case 0:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/ParseData.cpp"
                  ,0x206,"void SGParser::Generator::StdGrammarStackElement::Cleanup()");
  case 1:
    if ((uint *)*(undefined1 **)
                 &this_00->super_ParseStackElement<SGParser::Generator::StdGrammarToken> !=
        &this_00->Type) {
      operator_delete(*(undefined1 **)
                       &this_00->super_ParseStackElement<SGParser::Generator::StdGrammarToken>,
                      *(long *)&this_00->Type + 1);
    }
    uVar2 = 0x20;
    break;
  case 2:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00);
    goto LAB_00132216;
  case 3:
    Cleanup(this_00);
    this_00 = (StdGrammarStackElement *)(this->field_1).pData;
    uVar2 = 0x38;
    break;
  case 4:
    this_01 = *(StdGrammarStackElement **)
               &this_00->super_ParseStackElement<SGParser::Generator::StdGrammarToken>;
    pSVar1 = (StdGrammarStackElement *)
             (this_00->super_ParseStackElement<SGParser::Generator::StdGrammarToken>).TerminalMarker
    ;
    if (this_01 != pSVar1) {
      do {
        Cleanup(this_01);
        this_01 = this_01 + 1;
      } while (this_01 != pSVar1);
      this_00 = (StdGrammarStackElement *)(this->field_1).pStringVec;
      if (this_00 == (StdGrammarStackElement *)0x0) {
        this_00 = (StdGrammarStackElement *)0x0;
        goto LAB_00132216;
      }
      this_01 = *(StdGrammarStackElement **)
                 &this_00->super_ParseStackElement<SGParser::Generator::StdGrammarToken>;
    }
    if (this_01 != (StdGrammarStackElement *)0x0) {
      operator_delete(this_01,*(long *)&this_00->Type - (long)this_01);
    }
LAB_00132216:
    uVar2 = 0x18;
    break;
  default:
    goto switchD_00132197_default;
  }
  operator_delete(this_00,uVar2);
switchD_00132197_default:
  (this->field_1).pData = (void *)0x0;
  return;
}

Assistant:

void Cleanup() {
        if (!pData)
            return;

        switch (Type & DataTypeMask) {
            case DataVoid:      SG_ASSERT(false);  break; // Shouldn't be here
            case DataString:    delete pString;    break;
            case DataStringVec: delete pStringVec; break;

            case DataStackElement:
                pStackElement->Cleanup();
                delete pStackElement;
                break;

            case DataStackElementVec:
                for (auto& se : *pStackElementVec)
                    se.Cleanup();
                delete pStackElementVec;
                break;
        }

        pData = nullptr;
    }